

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match64_inc.h
# Opt level: O2

void InitializeH6(HasherHandle handle,BrotliEncoderParams *params)

{
  long lVar1;
  
  *(int *)(handle + 0x38) = 0x40 - *(int *)(handle + 4);
  *(ulong *)(handle + 0x40) = 0xffffffffffffffff >> (handle[0xc] * -8 & 0x3f);
  *(long *)(handle + 0x28) = 1L << ((byte)*(int *)(handle + 4) & 0x3f);
  lVar1 = 1L << (handle[8] & 0x3f);
  *(long *)(handle + 0x30) = lVar1;
  *(int *)(handle + 0x48) = (int)lVar1 + -1;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherHandle handle, const BrotliEncoderParams* params) {
  HasherCommon* common = GetHasherCommon(handle);
  HashLongestMatch* self = FN(Self)(handle);
  BROTLI_UNUSED(params);
  self->hash_shift_ = 64 - common->params.bucket_bits;
  self->hash_mask_ = (~((uint64_t)0U)) >> (64 - 8 * common->params.hash_len);
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
}